

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

string * __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::
prepare_compute_shader
          (string *__return_storage_ptr__,
          InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,string *function_definition,string *function_use,
          string *verification)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (tested_shader_type == COMPUTE_SHADER_TYPE) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1adc514);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(function_definition->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,shader_start_abi_cxx11_);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(function_use->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(verification->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InteractionFunctionCalls1<API>::prepare_compute_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& function_definition,
	const std::string& function_use, const std::string& verification)
{
	std::string compute_shader_source;

	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type)
	{
		compute_shader_source = "writeonly uniform image2D uni_image;\n"
								"\n";

		/* User-defined function definition. */
		compute_shader_source += function_definition;
		compute_shader_source += "\n\n";

		/* Main function definition. */
		compute_shader_source += shader_start;
		compute_shader_source += function_use;
		compute_shader_source += "\n\n";
		compute_shader_source += verification;
		compute_shader_source += "\n\n";
		compute_shader_source += "\n"
								 "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n"
								 "}\n"
								 "\n";
	}

	return compute_shader_source;
}